

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O0

void cfd::CoinSelection::ConvertToUtxo
               (uint64_t block_height,BlockHash *block_hash,Txid *txid,uint32_t vout,
               Script *locking_script,string *output_descriptor,Amount *amount,void *binary_data,
               Utxo *utxo,Script *scriptsig_template)

{
  undefined8 uVar1;
  Txid *in_RDX;
  BlockHash *in_RSI;
  Script *in_R8;
  string *in_R9;
  undefined8 *in_stack_00000008;
  UtxoData *in_stack_00000018;
  Script *in_stack_00000020;
  UtxoData utxo_data;
  UtxoData *in_stack_00000700;
  Utxo *in_stack_00000708;
  UtxoData *in_stack_00000710;
  string *in_stack_fffffffffffffa40;
  CfdException *this;
  BlockHash local_5a0;
  Txid local_580;
  undefined4 in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffaa4;
  Script local_558 [8];
  string local_368 [32];
  undefined8 local_348;
  undefined1 local_340;
  undefined4 local_338;
  Script local_b8;
  undefined1 local_7d;
  undefined1 local_69 [33];
  CfdSourceLocation local_48;
  string *local_30;
  Script *local_28;
  Txid *local_18;
  BlockHash *local_10;
  
  if (in_stack_00000018 == (UtxoData *)0x0) {
    local_48.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/cfd_utxo.cpp"
                 ,0x2f);
    local_48.filename = local_48.filename + 1;
    local_48.line = 0x3c9;
    local_48.funcname = "ConvertToUtxo";
    core::logger::warn<>(&local_48,"utxo is nullptr.");
    local_7d = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    this = (CfdException *)local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_69 + 1),"Failed to convert utxo. utxo is nullptr.",(allocator *)this
              );
    core::CfdException::CfdException
              (this,(CfdError)((ulong)uVar1 >> 0x20),in_stack_fffffffffffffa40);
    local_7d = 0;
    __cxa_throw(uVar1,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  (in_stack_00000018->address).type_ = kCfdSuccess;
  (in_stack_00000018->address).addr_type_ = 0;
  *(undefined8 *)&(in_stack_00000018->address).witness_ver_ = 0;
  (in_stack_00000018->redeem_script).script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_stack_00000018->redeem_script).script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_stack_00000018->redeem_script).script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (in_stack_00000018->redeem_script).script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (in_stack_00000018->redeem_script).script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (in_stack_00000018->redeem_script).script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (in_stack_00000018->locking_script).script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_stack_00000018->redeem_script)._vptr_Script = (_func_int **)0x0;
  (in_stack_00000018->locking_script).script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (in_stack_00000018->locking_script).script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_stack_00000018->locking_script).script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (in_stack_00000018->locking_script).script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (in_stack_00000018->locking_script)._vptr_Script = (_func_int **)0x0;
  (in_stack_00000018->locking_script).script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (in_stack_00000018->txid).data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&in_stack_00000018->vout = 0;
  (in_stack_00000018->txid).data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (in_stack_00000018->txid).data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (in_stack_00000018->block_hash).data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (in_stack_00000018->txid)._vptr_Txid = (_func_int **)0x0;
  (in_stack_00000018->block_hash).data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (in_stack_00000018->block_hash).data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  in_stack_00000018->block_height = 0;
  (in_stack_00000018->block_hash)._vptr_BlockHash = (_func_int **)0x0;
  *(undefined8 *)&(in_stack_00000018->address).address_ = 0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  UtxoData::UtxoData((UtxoData *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
  core::BlockHash::operator=(&local_5a0,local_10);
  core::Txid::operator=(&local_580,local_18);
  core::Script::operator=(local_558,local_28);
  std::__cxx11::string::operator=(local_368,local_30);
  local_348 = *in_stack_00000008;
  local_340 = *(undefined1 *)(in_stack_00000008 + 1);
  local_338 = 4;
  if (in_stack_00000020 != (Script *)0x0) {
    core::Script::operator=(&local_b8,in_stack_00000020);
  }
  UtxoUtil::ConvertToUtxo(in_stack_00000710,in_stack_00000708,in_stack_00000700);
  UtxoData::~UtxoData(in_stack_00000018);
  return;
}

Assistant:

void CoinSelection::ConvertToUtxo(
    uint64_t block_height, const BlockHash& block_hash, const Txid& txid,
    uint32_t vout, const Script& locking_script,
    const std::string& output_descriptor, const Amount& amount,
    const void* binary_data, Utxo* utxo, const Script* scriptsig_template) {
  if (utxo == nullptr) {
    warn(CFD_LOG_SOURCE, "utxo is nullptr.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to convert utxo. utxo is nullptr.");
  }
  memset(utxo, 0, sizeof(*utxo));

  UtxoData utxo_data;
  utxo_data.block_height = block_height;
  utxo_data.block_hash = block_hash;
  utxo_data.txid = txid;
  utxo_data.vout = vout;
  utxo_data.locking_script = locking_script;
  utxo_data.descriptor = output_descriptor;
  utxo_data.amount = amount;
  utxo_data.address_type = AddressType::kP2wpkhAddress;  // initialize
  if (scriptsig_template != nullptr) {
    utxo_data.scriptsig_template = *scriptsig_template;
  }
  memcpy(&utxo_data.binary_data, &binary_data, sizeof(void*));
  UtxoUtil::ConvertToUtxo(utxo_data, utxo, nullptr);
}